

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

void FastPForLib::Simple16<false>::unpack4_1_3_8(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *in;
  puVar2 = *out;
  *puVar2 = *(byte *)((long)puVar1 + 3) & 0xf;
  puVar2[1] = *puVar1 >> 0x15 & 7;
  puVar2[2] = *puVar1 >> 0x12 & 7;
  puVar2[3] = *puVar1 >> 0xf & 7;
  puVar2[4] = *puVar1 >> 0xc & 7;
  puVar2[5] = *puVar1 >> 9 & 7;
  puVar2[6] = *puVar1 >> 6 & 7;
  puVar2[7] = *puVar1 >> 3 & 7;
  puVar2[8] = *puVar1 & 7;
  *in = puVar1 + 1;
  *out = puVar2 + 9;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack4_1_3_8(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 24) & 0x0f;

  pout[1] = (pin[0] >> 21) & 0x07;
  pout[2] = (pin[0] >> 18) & 0x07;
  pout[3] = (pin[0] >> 15) & 0x07;
  pout[4] = (pin[0] >> 12) & 0x07;
  pout[5] = (pin[0] >> 9) & 0x07;
  pout[6] = (pin[0] >> 6) & 0x07;
  pout[7] = (pin[0] >> 3) & 0x07;
  pout[8] = pin[0] & 0x07;

  *in = pin + 1;
  *out = pout + 9;
}